

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O1

void __thiscall
TC_parser<true>::TC_parser
          (TC_parser<true> *this,char *reading_head,char *endLine,vw *all,example *ae)

{
  char cVar1;
  
  (this->spelling).end_array = (char *)0x0;
  (this->spelling).erase_count = 0;
  (this->spelling)._begin = (char *)0x0;
  (this->spelling)._end = (char *)0x0;
  if (endLine != reading_head) {
    this->beginLine = reading_head;
    this->reading_head = reading_head;
    this->endLine = endLine;
    this->p = all->p;
    this->redefine_some = all->redefine_some;
    this->redefine = &all->redefine;
    this->ae = ae;
    this->affix_features = all->affix_features;
    this->spelling_features = all->spelling_features;
    this->namespace_dictionaries = all->namespace_dictionaries;
    this->base = (char *)0x0;
    this->hash_seed = all->hash_seed;
    this->parse_mask = all->parse_mask;
    cVar1 = *reading_head;
    if (reading_head < endLine && cVar1 == '|') {
      do {
        this->reading_head = reading_head + 1;
        nameSpace(this);
        reading_head = this->reading_head;
        endLine = this->endLine;
        cVar1 = *reading_head;
        if (cVar1 != '|') break;
      } while (reading_head < endLine);
    }
    if (cVar1 != '\r' && reading_head != endLine) {
      parserWarning(this,"malformed example! \'|\' or EOL expected after : \"",this->beginLine,
                    reading_head,"\"");
    }
    if (this->base != (char *)0x0) {
      free(this->base);
      return;
    }
  }
  return;
}

Assistant:

TC_parser(char* reading_head, char* endLine, vw& all, example* ae)
  {
    spelling = v_init<char>();
    if (endLine != reading_head)
    {
      this->beginLine = reading_head;
      this->reading_head = reading_head;
      this->endLine = endLine;
      this->p = all.p;
      this->redefine_some = all.redefine_some;
      this->redefine = &all.redefine;
      this->ae = ae;
      this->affix_features = all.affix_features;
      this->spelling_features = all.spelling_features;
      this->namespace_dictionaries = all.namespace_dictionaries;
      this->base = nullptr;
      this->hash_seed = all.hash_seed;
      this->parse_mask = all.parse_mask;
      listNameSpace();
      if (base != nullptr)
        free(base);
    }
  }